

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::LeaveFrame(SQVM *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  CallInfo *local_38;
  SQInteger css;
  SQInteger last_stackbase;
  SQInteger last_top;
  SQVM *this_local;
  
  last_stackbase = this->_top;
  lVar1 = this->_stackbase;
  lVar2 = this->_callsstacksize;
  lVar3 = lVar2 + -1;
  this->_callsstacksize = lVar3;
  ::SQObjectPtr::Null(&this->ci->_closure);
  this->_stackbase = this->_stackbase - (long)this->ci->_prevstkbase;
  this->_top = this->_stackbase + (long)this->ci->_prevtop;
  if (lVar3 == 0) {
    local_38 = (CallInfo *)0x0;
  }
  else {
    local_38 = this->_callsstack + lVar2 + -2;
  }
  this->ci = local_38;
  if (this->_openouters != (SQOuter *)0x0) {
    CloseOuters(this,(this->_stack)._vals + lVar1);
  }
  while (this->_top <= last_stackbase) {
    ::SQObjectPtr::Null((this->_stack)._vals + last_stackbase);
    last_stackbase = last_stackbase + -1;
  }
  return;
}

Assistant:

void SQVM::LeaveFrame() {
    SQInteger last_top = _top;
    SQInteger last_stackbase = _stackbase;
    SQInteger css = --_callsstacksize;

    /* First clean out the call stack frame */
    ci->_closure.Null();
    _stackbase -= ci->_prevstkbase;
    _top = _stackbase + ci->_prevtop;
    ci = (css) ? &_callsstack[css-1] : NULL;

    if(_openouters) CloseOuters(&(_stack._vals[last_stackbase]));
    while (last_top >= _top) {
        _stack._vals[last_top--].Null();
    }
}